

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_sky.cpp
# Opt level: O2

void __thiscall
GLWall::SkyTop(GLWall *this,seg_t *seg,sector_t *fs,sector_t *bs,vertex_t *v1,vertex_t *v2)

{
  secplane_t *this_00;
  int iVar1;
  FPortal *pFVar2;
  FPortal *pFVar3;
  bool bVar4;
  FTexture *pFVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  
  iVar1 = fs->planes[1].Texture.texnum;
  if (iVar1 == skyflatnum.texnum) {
    if (bs->special == 0x59) {
      return;
    }
    if (bs->planes[1].Texture.texnum == iVar1) {
      this_00 = &bs->ceilingplane;
      dVar7 = secplane_t::ZatPoint(this_00,v1);
      dVar8 = secplane_t::ZatPoint(&bs->floorplane,v1);
      if (dVar8 < dVar7) {
        return;
      }
      dVar7 = secplane_t::ZatPoint(this_00,v2);
      dVar8 = secplane_t::ZatPoint(&bs->floorplane,v2);
      if (dVar8 < dVar7) {
        return;
      }
      if (bs->transdoor != false) {
        return;
      }
      if ((((bs->floorplane).normal.Y == 0.0 && (bs->floorplane).normal.X == 0.0) &&
          ((fs->floorplane).normal.Y == 0.0 && (fs->floorplane).normal.X == 0.0)) &&
         (fs->planes[0].TexZ + 1.0 == bs->planes[0].TexZ)) {
        pFVar5 = FTextureManager::operator()
                           (&TexMan,(FTextureID)seg->sidedef->textures[2].texture.texnum,false);
        if (pFVar5 == (FTexture *)0x0) {
          return;
        }
        if (pFVar5->UseType == '\r') {
          return;
        }
        pFVar5 = FTextureManager::operator()
                           (&TexMan,(FTextureID)seg->sidedef->textures[1].texture.texnum,false);
        if (((pFVar5 != (FTexture *)0x0) && ((seg->linedef->flags & 8) == 0)) &&
           (0.0 < seg->sidedef->textures[1].yOffset)) {
          this->ztop[0] = 32768.0;
          this->ztop[1] = 32768.0;
          dVar7 = secplane_t::ZatPoint(this_00,v2);
          fVar6 = (float)(dVar7 + seg->sidedef->textures[1].yOffset);
          this->zbottom[1] = fVar6;
          this->zbottom[0] = fVar6;
          bVar4 = false;
          goto LAB_003fa6db;
        }
      }
    }
    this->ztop[0] = 32768.0;
    this->ztop[1] = 32768.0;
    FTextureManager::operator()(&TexMan,(FTextureID)seg->sidedef->textures[0].texture.texnum,false);
    if (bs->planes[1].Texture.texnum == skyflatnum.texnum) {
      dVar7 = secplane_t::ZatPoint(&bs->ceilingplane,v1);
      this->zbottom[0] = (float)dVar7;
      dVar7 = secplane_t::ZatPoint(&bs->ceilingplane,v2);
      this->zbottom[1] = (float)dVar7;
      this->flags = this->flags | 4;
    }
    else {
      *(undefined8 *)this->zbottom = *(undefined8 *)this->zceil;
    }
  }
  else {
    if ((!gl_plane_reflection_i) || (fs->reflect[1] <= 0.0)) {
      if (sectorPortals.Array[fs->Portals[1]].mType - 1U < 3) {
        pFVar2 = fs->portals[1];
        if (pFVar2 == (FPortal *)0x0) {
          return;
        }
        pFVar3 = bs->portals[1];
        bVar4 = sector_t::PortalBlocksView(fs,1);
        if (bVar4) {
          return;
        }
        if ((pFVar2 == pFVar3) && (bVar4 = sector_t::PortalBlocksView(bs,1), !bVar4)) {
          return;
        }
      }
    }
    else if ((0.0 < bs->reflect[1]) && ((bs->ceilingplane).D == (fs->ceilingplane).D)) {
      return;
    }
    this->ztop[0] = 32768.0;
    this->ztop[1] = 32768.0;
    dVar7 = secplane_t::ZatPoint(&fs->ceilingplane,v1);
    this->zbottom[0] = (float)dVar7;
    dVar7 = secplane_t::ZatPoint(&fs->ceilingplane,v2);
    this->zbottom[1] = (float)dVar7;
  }
  bVar4 = true;
LAB_003fa6db:
  SkyPlane(this,fs,1,bVar4);
  return;
}

Assistant:

void GLWall::SkyTop(seg_t * seg,sector_t * fs,sector_t * bs,vertex_t * v1,vertex_t * v2)
{
	if (fs->GetTexture(sector_t::ceiling)==skyflatnum)
	{
		if (bs->special == GLSector_NoSkyDraw) return;
		if (bs->GetTexture(sector_t::ceiling)==skyflatnum) 
		{
			// if the back sector is closed the sky must be drawn!
			if (bs->ceilingplane.ZatPoint(v1) > bs->floorplane.ZatPoint(v1) ||
				bs->ceilingplane.ZatPoint(v2) > bs->floorplane.ZatPoint(v2) || bs->transdoor)
					return;

			// one more check for some ugly transparent door hacks
			if (!bs->floorplane.isSlope() && !fs->floorplane.isSlope())
			{
				if (bs->GetPlaneTexZ(sector_t::floor)==fs->GetPlaneTexZ(sector_t::floor)+1.)
				{
					FTexture * tex = TexMan(seg->sidedef->GetTexture(side_t::bottom));
					if (!tex || tex->UseType==FTexture::TEX_Null) return;

					// very, very, very ugly special case (See Icarus MAP14)
					// It is VERY important that this is only done for a floor height difference of 1
					// or it will cause glitches elsewhere.
					tex = TexMan(seg->sidedef->GetTexture(side_t::mid));
					if (tex != NULL && !(seg->linedef->flags & ML_DONTPEGTOP) &&
						seg->sidedef->GetTextureYOffset(side_t::mid) > 0)
					{
						ztop[0]=ztop[1]=32768.0f;
						zbottom[0]=zbottom[1]= 
							bs->ceilingplane.ZatPoint(v2) + seg->sidedef->GetTextureYOffset(side_t::mid);
						SkyPlane(fs, sector_t::ceiling, false);
						return;
					}
				}
			}
		}

		ztop[0]=ztop[1]=32768.0f;

		FTexture * tex = TexMan(seg->sidedef->GetTexture(side_t::top));
		if (bs->GetTexture(sector_t::ceiling) != skyflatnum)

		{
			zbottom[0]=zceil[0];
			zbottom[1]=zceil[1];
		}
		else
		{
			zbottom[0] = bs->ceilingplane.ZatPoint(v1);
			zbottom[1] = bs->ceilingplane.ZatPoint(v2);
			flags|=GLWF_SKYHACK;	// mid textures on such lines need special treatment!
		}
	}
	else 
	{
		float frontreflect = fs->GetReflect(sector_t::ceiling);
		if (frontreflect > 0)
		{
			float backreflect = bs->GetReflect(sector_t::ceiling);
			if (backreflect > 0 && bs->ceilingplane.fD() == fs->ceilingplane.fD())
			{
				// Don't add intra-portal line to the portal.
				return;
			}
		}
		else
		{
			int type = fs->GetPortalType(sector_t::ceiling);
			if (type == PORTS_STACKEDSECTORTHING || type == PORTS_PORTAL || type == PORTS_LINKEDPORTAL)
			{
				FPortal *pfront = fs->GetGLPortal(sector_t::ceiling);
				FPortal *pback = bs->GetGLPortal(sector_t::ceiling);
				if (pfront == NULL || fs->PortalBlocksView(sector_t::ceiling)) return;
				if (pfront == pback && !bs->PortalBlocksView(sector_t::ceiling)) return;
			}
		}

		// stacked sectors
		ztop[0] = ztop[1] = 32768.0f;
		zbottom[0] = fs->ceilingplane.ZatPoint(v1);
		zbottom[1] = fs->ceilingplane.ZatPoint(v2);

	}

	SkyPlane(fs, sector_t::ceiling, true);
}